

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::removeCutsFromModel(HighsPostsolveStack *this,HighsInt numCuts)

{
  reference pvVar1;
  int in_ESI;
  size_type in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  size_t i;
  size_t origRowIndexSize;
  size_type local_20;
  size_type __new_size;
  
  *(int *)(in_RDI + 0xdc) = *(int *)(in_RDI + 0xdc) - in_ESI;
  __new_size = in_RDI;
  std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78))
  ;
  local_20 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78));
  while ((local_20 != 0 &&
         (pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),local_20 - 1),
         *(int *)(in_RDI + 0xdc) <= *pvVar1))) {
    local_20 = local_20 - 1;
  }
  std::vector<int,_std::allocator<int>_>::resize(unaff_retaddr,__new_size);
  return;
}

Assistant:

void removeCutsFromModel(HighsInt numCuts) {
    origNumRow -= numCuts;

    size_t origRowIndexSize = origRowIndex.size();
    for (size_t i = origRowIndex.size(); i > 0; --i) {
      if (origRowIndex[i - 1] < origNumRow) break;
      --origRowIndexSize;
    }

    origRowIndex.resize(origRowIndexSize);
  }